

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

void calculate_breakpoint_mask(void)

{
  uint uVar1;
  Breakpoint *pBVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar3 = 0xffff;
  s_breakpoint_mask_0 = 0xffff;
  s_breakpoint_mask_1 = 0xffff;
  if (0 < (long)s_breakpoint_max_id) {
    lVar4 = 0;
    uVar5 = 0xffff;
    do {
      if ((~s_breakpoints[lVar4].field_0x7 & 3) == 0) {
        pBVar2 = s_breakpoints + lVar4;
        uVar1._0_2_ = pBVar2->addr;
        uVar1._2_1_ = pBVar2->bank;
        uVar1._3_1_ = pBVar2->field_0x7;
        uVar5 = uVar5 & uVar1;
        uVar3 = uVar3 & ~uVar1;
        s_breakpoint_mask_0 = (undefined2)uVar3;
        s_breakpoint_mask_1 = (undefined2)uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (s_breakpoint_max_id != lVar4);
  }
  return;
}

Assistant:

static void calculate_breakpoint_mask(void) {
  s_breakpoint_mask[0] = 0xffffu;
  s_breakpoint_mask[1] = 0xffffu;
  int id;
  for (id = 0; id < s_breakpoint_max_id; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!(bp->valid && bp->enabled)) {
      continue;
    }
    s_breakpoint_mask[0] &= ~bp->addr;
    s_breakpoint_mask[1] &= bp->addr;
  }
}